

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O3

void glfwSetGammaRamp(GLFWmonitor *handle,GLFWgammaramp *ramp)

{
  if (handle == (GLFWmonitor *)0x0) {
    __assert_fail("monitor != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/glfw/src/monitor.c"
                  ,0x1c8,"void glfwSetGammaRamp(GLFWmonitor *, const GLFWgammaramp *)");
  }
  if (ramp == (GLFWgammaramp *)0x0) {
    __assert_fail("ramp != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/glfw/src/monitor.c"
                  ,0x1c9,"void glfwSetGammaRamp(GLFWmonitor *, const GLFWgammaramp *)");
  }
  if (ramp->red == (unsigned_short *)0x0) {
    __assert_fail("ramp->red != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/glfw/src/monitor.c"
                  ,0x1ca,"void glfwSetGammaRamp(GLFWmonitor *, const GLFWgammaramp *)");
  }
  if (ramp->green != (unsigned_short *)0x0) {
    if (ramp->blue == (unsigned_short *)0x0) {
      __assert_fail("ramp->blue != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/glfw/src/monitor.c"
                    ,0x1cc,"void glfwSetGammaRamp(GLFWmonitor *, const GLFWgammaramp *)");
    }
    if (ramp->size != 0) {
      if (_glfwInitialized != 0) {
        if (*(int *)(handle + 0x58) == 0) {
          _glfwPlatformGetGammaRamp((_GLFWmonitor *)handle,(GLFWgammaramp *)(handle + 0x40));
        }
        _glfwPlatformSetGammaRamp((_GLFWmonitor *)handle,ramp);
        return;
      }
      _glfwInputError(0x10001,(char *)0x0);
      return;
    }
    _glfwInputError(0x10004,"Invalid gamma ramp size %i",0);
    return;
  }
  __assert_fail("ramp->green != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/glfw/src/monitor.c"
                ,0x1cb,"void glfwSetGammaRamp(GLFWmonitor *, const GLFWgammaramp *)");
}

Assistant:

GLFWAPI void glfwSetGammaRamp(GLFWmonitor* handle, const GLFWgammaramp* ramp)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);
    assert(ramp != NULL);
    assert(ramp->red != NULL);
    assert(ramp->green != NULL);
    assert(ramp->blue != NULL);

    if (ramp->size <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid gamma ramp size %i",
                        ramp->size);
        return;
    }

    _GLFW_REQUIRE_INIT();

    if (!monitor->originalRamp.size)
        _glfwPlatformGetGammaRamp(monitor, &monitor->originalRamp);

    _glfwPlatformSetGammaRamp(monitor, ramp);
}